

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O2

void __thiscall gamespace::GameScreenInputState::mouse(GameScreenInputState *this,double x,double y)

{
  Point PVar1;
  
  this->_last_x = x;
  this->_last_y = y;
  if (this->_mouse_mode != UIINTERACTION) {
    qe::Camera::mouseMoved
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,this->_impl->_ctxt->_deltat,x
               ,y,this->_mouse_mode == LOCKED);
    if (this->_mouse_mode != LOCKED) {
      return;
    }
    qe::Context::resetMouse(this->_impl->_ctxt);
    return;
  }
  if (this->_selected_menu != (Renderable *)0x0) {
    PVar1.x = ((float)x + (this->_origin_save).x) - (this->_mouse_save).x;
    PVar1.y = ((float)(this->_resy - y) + (this->_origin_save).y) - (this->_mouse_save).y;
    (this->_selected_menu->super_Area)._origin = PVar1;
    (**(code **)(*this->_selected_menu->_payload + 0x10))();
    return;
  }
  __assert_fail("_selected_menu",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/game/screens/gameinput.cpp"
                ,0x41,"void gamespace::GameScreenInputState::mouse(double, double)");
}

Assistant:

void GameScreenInputState::mouse(double x, double y) {
    _last_x = x;
    _last_y = y;
    if(_mouse_mode == UIINTERACTION) {
        assert(_selected_menu);
        _selected_menu->origin() = _origin_save + ui::Point {(float)x, (float)(_resy - y)} - _mouse_save;
        ((CoordinateMenu*)_selected_menu->payload())->invalidate();
    } else {
        _impl->camera()->mouseMoved(_impl->context()->deltaT(), x, y, _mouse_mode == LOCKED);
        if(_mouse_mode == LOCKED) {
            _impl->context()->resetMouse();
        }
    }
}